

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swap.h
# Opt level: O0

void __thiscall
Eigen::SwapWrapper<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>>::
copyPacket<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,1,1>
          (SwapWrapper<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *this,
          Index rowId,Index colId,
          DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *other)

{
  EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_> *in_RCX;
  double rowId_00;
  PacketScalar *val;
  MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_0> *this_00;
  Index col;
  PacketScalar adVar1;
  Packet tmp;
  Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true> *_other;
  Index in_stack_ffffffffffffffc0;
  Index col_00;
  Index in_stack_ffffffffffffffc8;
  MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>
  *in_stack_ffffffffffffffd0;
  MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_0> *this_01;
  
  EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>_>::const_cast_derived
            (in_RCX);
  adVar1 = MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>::packet<1>
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0)
  ;
  rowId_00 = adVar1[0];
  this_01 = this_00;
  adVar1 = MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>::packet<1>
                     (this_00,(Index)rowId_00,in_stack_ffffffffffffffc0);
  val = adVar1[0];
  col_00 = col;
  MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_1>::writePacket<1>
            ((MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_1> *)this_01,
             (Index)rowId_00,col,val);
  MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_1>::writePacket<1>
            ((MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_1> *)this_01,
             (Index)rowId_00,col_00,val);
  return;
}

Assistant:

void copyPacket(Index rowId, Index colId, const DenseBase<OtherDerived>& other)
    {
      OtherDerived& _other = other.const_cast_derived();
      eigen_internal_assert(rowId >= 0 && rowId < rows()
                        && colId >= 0 && colId < cols());
      Packet tmp = m_expression.template packet<StoreMode>(rowId, colId);
      m_expression.template writePacket<StoreMode>(rowId, colId,
        _other.template packet<LoadMode>(rowId, colId)
      );
      _other.template writePacket<LoadMode>(rowId, colId, tmp);
    }